

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAndOr(Gia_Man_t *p,int nOuts,int fUseOr,int fCompl)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_40;
  int local_3c;
  int iResult;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fCompl_local;
  int fUseOr_local;
  int nOuts_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x954,"Gia_Man_t *Gia_ManDupAndOr(Gia_Man_t *, int, int, int)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  Gia_ManHashAlloc(p_00);
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_3c < iVar1) {
      _iResult = Gia_ManCi(p,local_3c);
      bVar6 = _iResult != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iResult->Value = uVar2;
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    bVar6 = false;
    if (local_3c < p->nObjs) {
      _iResult = Gia_ManObj(p,local_3c);
      bVar6 = _iResult != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_iResult);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iResult);
      iLit1 = Gia_ObjFanin1Copy(_iResult);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
      _iResult->Value = uVar2;
    }
    local_3c = local_3c + 1;
  }
  if (fUseOr == 0) {
    local_40 = 1;
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        _iResult = Gia_ManCo(p,local_3c);
        bVar6 = _iResult != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFanin0Copy(_iResult);
      local_40 = Gia_ManHashAnd(p_00,local_40,iVar1);
      local_3c = local_3c + 1;
    }
  }
  else {
    local_40 = 0;
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        _iResult = Gia_ManCo(p,local_3c);
        bVar6 = _iResult != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFanin0Copy(_iResult);
      local_40 = Gia_ManHashOr(p_00,local_40,iVar1);
      local_3c = local_3c + 1;
    }
  }
  iVar1 = Abc_LitNotCond(local_40,(uint)(0 < fCompl));
  for (local_3c = 0; local_3c < nOuts; local_3c = local_3c + 1) {
    Gia_ManAppendCo(p_00,iVar1);
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManDupAndOr( Gia_Man_t * p, int nOuts, int fUseOr, int fCompl )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iResult;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fUseOr ) // construct OR of all POs
    {
        iResult = 0;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashOr( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    else // construct AND of all POs
    {
        iResult = 1;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashAnd( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    iResult = Abc_LitNotCond( iResult, (int)(fCompl > 0) );
//    Gia_ManForEachPo( p, pObj, i )
//        pObj->Value = Gia_ManAppendCo( pNew, iResult );
    for ( i = 0; i < nOuts; i++ )
        Gia_ManAppendCo( pNew, iResult );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}